

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O1

bool ON_IsDuplicateKnotVector
               (int order,int cv_count,double *knot,double *other_knot,bool bIgnoreParameterization)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  ON_Interval dom;
  ON_Interval other_dom;
  ON_Interval local_50;
  ON_Interval local_40;
  
  bVar6 = knot != (double *)0x0;
  bVar7 = other_knot != (double *)0x0;
  bVar1 = 1 < order;
  bVar2 = order <= cv_count;
  bVar5 = (bVar2 && bVar1) && (bVar7 && bVar6);
  if ((bVar2 && bVar1) && (bVar7 && bVar6)) {
    uVar3 = ON_KnotCount(order,cv_count);
    if (bIgnoreParameterization) {
      ON_Interval::ON_Interval(&local_50,knot[(long)order + -2],knot[(long)cv_count + -1]);
      ON_Interval::ON_Interval
                (&local_40,other_knot[(long)order + -2],other_knot[(long)cv_count + -1]);
      if (((bVar2 && bVar1) && (bVar7 && bVar6)) && 0 < (int)uVar3) {
        uVar4 = 1;
        do {
          dVar8 = ON_Interval::NormalizedParameterAt(&local_50,knot[uVar4 - 1]);
          dVar9 = ON_Interval::NormalizedParameterAt(&local_50,other_knot[uVar4 - 1]);
          bVar5 = ABS(dVar8 - dVar9) <= 2.3283064365386963e-10;
          if (uVar3 <= uVar4) {
            return bVar5;
          }
          uVar4 = uVar4 + 1;
        } while (ABS(dVar8 - dVar9) <= 2.3283064365386963e-10);
      }
    }
    else if (((bVar2 && bVar1) && (bVar7 && bVar6)) && 0 < (int)uVar3) {
      uVar4 = 1;
      while( true ) {
        dVar8 = knot[uVar4 - 1];
        dVar9 = other_knot[uVar4 - 1];
        bVar5 = (bool)(-(dVar8 == dVar9) & 1);
        if (uVar3 <= uVar4) break;
        uVar4 = uVar4 + 1;
        if (dVar8 != dVar9) {
          return bVar5;
        }
        if (NAN(dVar8) || NAN(dVar9)) {
          return bVar5;
        }
      }
    }
  }
  return bVar5;
}

Assistant:

static bool ON_IsDuplicateKnotVector( int order, int cv_count, 
               const double* knot, const double* other_knot,
               bool bIgnoreParameterization )
{
  bool rc = (    0 != knot 
              && 0 != other_knot 
              && order >= 2 
              && cv_count >= order);

  if (rc)
  {
    const int knot_count = ON_KnotCount( order, cv_count );
    int i;
    if ( bIgnoreParameterization )
    {
      const ON_Interval dom(knot[order-2],knot[cv_count-1]);
      const ON_Interval other_dom(other_knot[order-2],other_knot[cv_count-1]);
      double k, other_k;
      for ( i = 0; i < knot_count && rc; i++ )
      {
        k = dom.NormalizedParameterAt(knot[i]);
        other_k = dom.NormalizedParameterAt(other_knot[i]);
        rc = (fabs(k-other_k) <= ON_ZERO_TOLERANCE);
      }
    }
    else
    {
      for ( i = 0; i < knot_count && rc; i++ )
      {
        rc = (knot[i] == other_knot[i]);
      }
    }
  }
  return rc;
}